

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::FindPropertyIndex(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                    *this,ValueType *name,SizeType *outIndex)

{
  uint uVar1;
  SizeType SVar2;
  SizeType SVar3;
  int iVar4;
  Ch *__s2;
  Ch *__s1;
  long lVar5;
  SizeType index;
  ulong uVar6;
  
  SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetStringLength(name);
  __s2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetString(name);
  lVar5 = 0;
  uVar6 = 0;
  do {
    uVar1 = this->propertyCount_;
    if (uVar1 <= uVar6) {
LAB_001423d7:
      return uVar6 < uVar1;
    }
    SVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                       ((long)&(this->properties_->name).data_ + lVar5));
    if (SVar3 == SVar2) {
      __s1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                       ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        ((long)&(this->properties_->name).data_ + lVar5));
      iVar4 = bcmp(__s1,__s2,(ulong)SVar2);
      if (iVar4 == 0) {
        *outIndex = (SizeType)uVar6;
        goto LAB_001423d7;
      }
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x38;
  } while( true );
}

Assistant:

bool FindPropertyIndex(const ValueType& name, SizeType* outIndex) const {
        SizeType len = name.GetStringLength();
        const Ch* str = name.GetString();
        for (SizeType index = 0; index < propertyCount_; index++)
            if (properties_[index].name.GetStringLength() == len &&
                (std::memcmp(properties_[index].name.GetString(), str, sizeof(Ch) * len) == 0))
            {
                *outIndex = index;
                return true;
            }
        return false;
    }